

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlockfile.cpp
# Opt level: O2

bool __thiscall QLockFile::removeStaleLockFile(QLockFile *this)

{
  QLockFilePrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d_ptr).d;
  if (this_00->isLocked == true) {
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning
              (&local_28,"removeStaleLockFile can only be called when not holding the lock");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return false;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    bVar1 = QLockFilePrivate::removeStaleLock(this_00);
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool QLockFile::removeStaleLockFile()
{
    Q_D(QLockFile);
    if (d->isLocked) {
        qWarning("removeStaleLockFile can only be called when not holding the lock");
        return false;
    }
    return d->removeStaleLock();
}